

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_gmsh.cpp
# Opt level: O0

void Omega_h::gmsh::anon_unknown_0::read_internal(istream *stream,Mesh *mesh)

{
  pointer *this;
  double dVar1;
  value_type vVar2;
  uint uVar3;
  LO size_in;
  int family_00;
  Mesh *pMVar4;
  bool bVar5;
  int iVar6;
  Omega_h_Family OVar7;
  void *pvVar8;
  ulong uVar9;
  size_type sVar10;
  mapped_type *pmVar11;
  reference pvVar12;
  reference pvVar13;
  pointer ppVar14;
  unordered_map<int,int,std::hash<int>,std::equal_to<int>,std::allocator<std::pair<int_const,int>>>
  *puVar15;
  reference this_00;
  reference pvVar16;
  vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>> *this_01;
  double *pdVar17;
  reference pvVar18;
  int *piVar19;
  uint *puVar20;
  LOs *ev2v;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__buf;
  void *__buf_00;
  pair<std::__detail::_Node_iterator<std::pair<const_int,_int>,_false,_false>,_bool> pVar21;
  uint local_a14;
  uint local_a04;
  uint local_9f8;
  uint local_9f0;
  uint local_9ec;
  uint local_9e8;
  uint local_9d8;
  uint local_9cc;
  uint local_9c4;
  I32 local_964;
  I32 local_954;
  I32 local_948;
  I32 local_940;
  I32 local_93c;
  I32 local_938;
  I32 local_928;
  I32 local_91c;
  I32 local_914;
  int local_8d4;
  int local_8c4;
  int local_8b8;
  int local_8b0;
  int local_8ac;
  int local_8a8;
  int local_898;
  int local_88c;
  int local_884;
  Write<int> local_7c0;
  Read<int> local_7b0;
  Read<int> local_7a0;
  Write<double> local_790;
  Read<double> local_780;
  Read<int> local_770;
  Write<int> local_760;
  undefined1 local_750 [8];
  Read<int> eqv2v;
  int local_738;
  Int j_4;
  LO i_5;
  undefined1 local_710 [8];
  HostWrite<int> host_class_id;
  string local_6f8 [32];
  undefined1 local_6d8 [8];
  HostWrite<int> host_ev2v;
  LO ndim_ents;
  Int neev_2;
  Int ent_dim;
  Int j_3;
  LO i_4;
  undefined1 local_690 [8];
  HostWrite<double> host_coords;
  __cxx11 local_678 [4];
  Int max_dim;
  string physical_name;
  int local_654;
  int physical_2;
  int entity;
  value_type *pair;
  const_iterator __end4;
  const_iterator __begin4;
  value_type *__range4;
  value_type *entities;
  int local_620;
  Int dim_4;
  int local_618;
  Int j_2;
  LO node_number_4;
  Int neev_1;
  Int j_1;
  Int tag;
  undefined1 local_600;
  int local_5f8;
  int local_5f4;
  Int elementary_1;
  Int physical_1;
  Int ntags_1;
  Int dim_3;
  Int type_1;
  LO number_3;
  LO i_3;
  int local_5d4;
  I32 node_number_3;
  Int k_1;
  I32 ignored;
  Int k;
  undefined1 local_5c0;
  int local_5b8;
  int local_5b4;
  I32 elementary;
  I32 physical;
  I32 number_2;
  Int j;
  Int neev;
  Int dim_2;
  I32 ntags;
  I32 nfollow;
  I32 type;
  LO i_2;
  array<std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>,_4UL>
  ent2physical;
  iterator iStack_4a8;
  LO nents;
  _Self local_4a0;
  iterator it;
  int local_490;
  int node_number_2;
  int ent_node;
  int ent_number;
  int block_ent;
  int nodes_per_ent;
  Int dim_1;
  int num_block_ents;
  int ent_type;
  int class_dim_2;
  int class_id_2;
  int entity_block_2;
  int element_tag;
  int total_num_ents;
  int num_entity_blocks_1;
  Omega_h_Family family;
  array<std::vector<int,_std::allocator<int>_>,_4UL> ent_nodes;
  array<std::vector<int,_std::allocator<int>_>,_4UL> ent_class_ids;
  string local_390 [32];
  undefined1 local_370 [8];
  Vector<3> coords_2;
  LO number_1;
  LO i_1;
  Vector<3> coords_1;
  int local_330;
  int node_number_1;
  int block_node_2;
  int num_block_nodes_1;
  int node_type_1;
  int class_dim_1;
  int class_id_1;
  int entity_block_1;
  Vector<3> coords;
  int block_node_1;
  int position;
  int node_number;
  int block_node;
  int num_block_nodes;
  int node_type;
  int class_dim;
  int class_id;
  int entity_block;
  int node_tag;
  int num_entity_blocks;
  int nnodes;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> node_number_map;
  vector<Omega_h::Vector<3>,_std::allocator<Omega_h::Vector<3>_>_> node_coords;
  string local_280 [32];
  undefined8 local_260;
  undefined8 local_250;
  undefined8 local_248;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_240;
  undefined8 local_238;
  string local_230 [8];
  string line;
  allocator local_209;
  string local_208 [32];
  value_type local_1e8 [32];
  string local_1c8 [8];
  string name;
  int local_1a4;
  int local_1a0;
  Int number;
  Int dim;
  int i;
  Int num_physicals;
  undefined1 local_170 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  physical_names;
  int one;
  bool needs_swapping;
  int iStack_14c;
  bool is_binary;
  Int data_size;
  Int file_type;
  Real format;
  allocator local_129;
  string local_128 [32];
  Mesh *local_108;
  Mesh *mesh_local;
  istream *stream_local;
  int local_f0;
  undefined4 local_ec;
  Int local_e8;
  int local_e4;
  undefined4 local_e0;
  int local_dc;
  int local_d8;
  Int local_d4;
  reference local_d0;
  undefined4 local_c4;
  undefined1 *local_c0;
  undefined4 local_b4;
  undefined1 *local_b0;
  undefined4 local_a4;
  double *local_a0;
  undefined4 local_94;
  LO *local_90;
  undefined4 local_84;
  LO *local_80;
  undefined4 local_74;
  double *local_70;
  undefined4 local_64;
  int *local_60;
  undefined4 local_54;
  int *local_50;
  undefined4 local_44;
  double *local_40;
  undefined4 local_38;
  int local_34;
  undefined4 local_30;
  Int local_2c;
  undefined4 local_28;
  LO local_24;
  undefined4 local_20;
  int local_1c;
  undefined4 local_18;
  Int local_14;
  undefined4 local_10;
  LO local_c;
  
  local_108 = mesh;
  mesh_local = (Mesh *)stream;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_128,"$MeshFormat",&local_129);
  seek_line(stream,(string *)local_128);
  std::__cxx11::string::~string(local_128);
  std::allocator<char>::~allocator((allocator<char> *)&local_129);
  pvVar8 = (void *)std::istream::operator>>(mesh_local,(double *)&data_size);
  pvVar8 = (void *)std::istream::operator>>(pvVar8,&stack0xfffffffffffffeb4);
  std::istream::operator>>(pvVar8,&one);
  if ((iStack_14c != 0) && (iStack_14c != 1)) {
    fail("assertion %s failed at %s +%d\n","file_type == 0 || file_type == 1",
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_gmsh.cpp"
         ,0xdd);
  }
  physical_names.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = iStack_14c == 1;
  physical_names.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
  if ((bool)physical_names.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_) {
    eat_newlines((istream *)mesh_local);
    binary::read_value<int>
              ((istream *)mesh_local,
               (int *)&physical_names.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,false);
    if ((int)physical_names.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage != 1) {
      physical_names.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
      binary::swap_bytes<int>
                ((int *)&physical_names.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if ((int)physical_names.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage != 1) {
        fail("assertion %s failed at %s +%d\n","one == 1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_gmsh.cpp"
             ,0xe7);
      }
    }
  }
  if (one == 8) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_170);
    pMVar4 = mesh_local;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&num_physicals,"$PhysicalNames",(allocator *)((long)&i + 3));
    bVar5 = seek_optional_section((istream *)pMVar4,(string *)&num_physicals);
    std::__cxx11::string::~string((string *)&num_physicals);
    std::allocator<char>::~allocator((allocator<char> *)((long)&i + 3));
    if (bVar5) {
      read<int>((istream *)mesh_local,&dim,
                (bool)(physical_names.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1),
                (bool)(physical_names.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ & 1));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::reserve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_170,(long)dim);
      eat_newlines((istream *)mesh_local);
      for (number = 0; number < dim; number = number + 1) {
        read<int>((istream *)mesh_local,&local_1a0,
                  (bool)(physical_names.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1),
                  (bool)(physical_names.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ & 1));
        read<int>((istream *)mesh_local,&local_1a4,
                  (bool)(physical_names.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1),
                  (bool)(physical_names.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ & 1));
        if (local_1a4 != number + 1) {
          fail("assertion %s failed at %s +%d\n","number == i + 1",
               "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_gmsh.cpp"
               ,0xf5);
        }
        std::__cxx11::string::string(local_1c8);
        std::operator>>((istream *)mesh_local,local_1c8);
        std::__cxx11::string::size();
        std::__cxx11::string::substr((ulong)local_1e8,(ulong)local_1c8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_170,local_1e8);
        std::__cxx11::string::~string((string *)local_1e8);
        std::__cxx11::string::~string(local_1c8);
      }
    }
    pMVar4 = mesh_local;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_208,"$Entities",&local_209);
    bVar5 = seek_optional_section((istream *)pMVar4,(string *)local_208);
    std::__cxx11::string::~string(local_208);
    std::allocator<char>::~allocator((allocator<char> *)&local_209);
    if (bVar5) {
      read_internal_entities_section
                (local_108,_data_size,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_170,(istream *)mesh_local,
                 (bool)(physical_names.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1),
                 (bool)(physical_names.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ & 1));
      std::__cxx11::string::string(local_230);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)mesh_local,local_230);
      uVar9 = std::__cxx11::string::empty();
      if ((uVar9 & 1) == 0) {
        local_248 = std::__cxx11::string::begin();
        local_250 = std::__cxx11::string::end();
        local_240 = std::
                    remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,Omega_h::gmsh::(anonymous_namespace)::read_internal(std::istream&,Omega_h::Mesh*)::__0>
                              (local_248,local_250);
        __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                  ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_238,&local_240);
        local_260 = std::__cxx11::string::erase(local_230,local_238);
      }
      uVar9 = std::__cxx11::string::empty();
      if ((uVar9 & 1) == 0) {
        fail("assertion %s failed at %s +%d\n","line.empty()",
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_gmsh.cpp"
             ,0x105);
      }
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)mesh_local,local_230);
      bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_230,"$EndEntities");
      if (!bVar5) {
        fail("assertion %s failed at %s +%d\n","line == \"$EndEntities\"",
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_gmsh.cpp"
             ,0x107);
      }
      std::__cxx11::string::~string(local_230);
    }
    pMVar4 = mesh_local;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_280,"$Nodes",
               (allocator *)
               ((long)&node_coords.
                       super__Vector_base<Omega_h::Vector<3>,_std::allocator<Omega_h::Vector<3>_>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    seek_line((istream *)pMVar4,(string *)local_280);
    std::__cxx11::string::~string(local_280);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&node_coords.
                       super__Vector_base<Omega_h::Vector<3>,_std::allocator<Omega_h::Vector<3>_>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    std::vector<Omega_h::Vector<3>,_std::allocator<Omega_h::Vector<3>_>_>::vector
              ((vector<Omega_h::Vector<3>,_std::allocator<Omega_h::Vector<3>_>_> *)
               &node_number_map._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::map
              ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
               &num_entity_blocks);
    if (_data_size < 4.0) {
      std::istream::operator>>(mesh_local,&node_tag);
      if (node_tag < 0) {
        fail("assertion %s failed at %s +%d\n","nnodes >= 0",
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_gmsh.cpp"
             ,0x145);
      }
      std::vector<Omega_h::Vector<3>,_std::allocator<Omega_h::Vector<3>_>_>::reserve
                ((vector<Omega_h::Vector<3>,_std::allocator<Omega_h::Vector<3>_>_> *)
                 &node_number_map._M_t._M_impl.super__Rb_tree_header._M_node_count,(long)node_tag);
      eat_newlines((istream *)mesh_local);
      for (coords_2.super_Few<double,_3>.array_[2]._4_4_ = 0;
          coords_2.super_Few<double,_3>.array_[2]._4_4_ < node_tag;
          coords_2.super_Few<double,_3>.array_[2]._4_4_ =
               coords_2.super_Few<double,_3>.array_[2]._4_4_ + 1) {
        read<int>((istream *)mesh_local,(int *)(coords_2.super_Few<double,_3>.array_ + 2),
                  (bool)(physical_names.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1),
                  (bool)(physical_names.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ & 1));
        if (coords_2.super_Few<double,_3>.array_[2]._0_4_ !=
            coords_2.super_Few<double,_3>.array_[2]._4_4_ + 1) {
          fail("assertion %s failed at %s +%d\n","number == i + 1",
               "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_gmsh.cpp"
               ,0x14e);
        }
        local_a0 = (double *)local_370;
        local_a4 = 0;
        read<double>((istream *)mesh_local,local_a0,
                     (bool)(physical_names.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1),
                     (bool)(physical_names.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ & 1));
        local_b0 = local_370;
        local_b4 = 1;
        read<double>((istream *)mesh_local,(double *)&coords_2,
                     (bool)(physical_names.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1),
                     (bool)(physical_names.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ & 1));
        local_c0 = local_370;
        local_c4 = 2;
        read<double>((istream *)mesh_local,coords_2.super_Few<double,_3>.array_ + 1,
                     (bool)(physical_names.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1),
                     (bool)(physical_names.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ & 1));
        std::vector<Omega_h::Vector<3>,_std::allocator<Omega_h::Vector<3>_>_>::push_back
                  ((vector<Omega_h::Vector<3>,_std::allocator<Omega_h::Vector<3>_>_> *)
                   &node_number_map._M_t._M_impl.super__Rb_tree_header._M_node_count,
                   (value_type *)local_370);
      }
    }
    else {
      eat_newlines((istream *)mesh_local);
      read<int>((istream *)mesh_local,&entity_block,
                (bool)(physical_names.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1),
                (bool)(physical_names.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ & 1));
      read<int>((istream *)mesh_local,&node_tag,
                (bool)(physical_names.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1),
                (bool)(physical_names.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ & 1));
      std::vector<Omega_h::Vector<3>,_std::allocator<Omega_h::Vector<3>_>_>::reserve
                ((vector<Omega_h::Vector<3>,_std::allocator<Omega_h::Vector<3>_>_> *)
                 &node_number_map._M_t._M_impl.super__Rb_tree_header._M_node_count,(long)node_tag);
      if (_data_size < 4.1) {
        for (class_dim_1 = 0; class_dim_1 < entity_block; class_dim_1 = class_dim_1 + 1) {
          read<int>((istream *)mesh_local,&node_type_1,
                    (bool)(physical_names.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1),
                    (bool)(physical_names.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ & 1));
          read<int>((istream *)mesh_local,&num_block_nodes_1,
                    (bool)(physical_names.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1),
                    (bool)(physical_names.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ & 1));
          read<int>((istream *)mesh_local,&block_node_2,
                    (bool)(physical_names.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1),
                    (bool)(physical_names.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ & 1));
          read<int>((istream *)mesh_local,&node_number_1,
                    (bool)(physical_names.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1),
                    (bool)(physical_names.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ & 1));
          for (local_330 = 0; local_330 < node_number_1; local_330 = local_330 + 1) {
            read<int>((istream *)mesh_local,
                      (int *)((long)coords_1.super_Few<double,_3>.array_ + 0x14),
                      (bool)(physical_names.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1),
                      (bool)(physical_names.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ & 1));
            sVar10 = std::vector<Omega_h::Vector<3>,_std::allocator<Omega_h::Vector<3>_>_>::size
                               ((vector<Omega_h::Vector<3>,_std::allocator<Omega_h::Vector<3>_>_> *)
                                &node_number_map._M_t._M_impl.super__Rb_tree_header._M_node_count);
            pmVar11 = std::
                      map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                      operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                  *)&num_entity_blocks,
                                 (key_type *)((long)coords_1.super_Few<double,_3>.array_ + 0x14));
            *pmVar11 = (mapped_type)sVar10;
            local_70 = (double *)&number_1;
            local_74 = 0;
            read<double>((istream *)mesh_local,local_70,
                         (bool)(physical_names.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1),
                         (bool)(physical_names.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ & 1));
            local_80 = &number_1;
            local_84 = 1;
            read<double>((istream *)mesh_local,(double *)&coords_1,
                         (bool)(physical_names.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1),
                         (bool)(physical_names.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ & 1));
            local_90 = &number_1;
            local_94 = 2;
            read<double>((istream *)mesh_local,coords_1.super_Few<double,_3>.array_ + 1,
                         (bool)(physical_names.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1),
                         (bool)(physical_names.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ & 1));
            std::vector<Omega_h::Vector<3>,_std::allocator<Omega_h::Vector<3>_>_>::push_back
                      ((vector<Omega_h::Vector<3>,_std::allocator<Omega_h::Vector<3>_>_> *)
                       &node_number_map._M_t._M_impl.super__Rb_tree_header._M_node_count,
                       (value_type *)&number_1);
          }
        }
      }
      else {
        read<int>((istream *)mesh_local,&class_id,
                  (bool)(physical_names.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1),
                  (bool)(physical_names.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ & 1));
        read<int>((istream *)mesh_local,&class_id,
                  (bool)(physical_names.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1),
                  (bool)(physical_names.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ & 1));
        for (class_dim = 0; class_dim < entity_block; class_dim = class_dim + 1) {
          read<int>((istream *)mesh_local,&num_block_nodes,
                    (bool)(physical_names.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1),
                    (bool)(physical_names.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ & 1));
          read<int>((istream *)mesh_local,&node_type,
                    (bool)(physical_names.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1),
                    (bool)(physical_names.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ & 1));
          read<int>((istream *)mesh_local,&block_node,
                    (bool)(physical_names.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1),
                    (bool)(physical_names.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ & 1));
          read<int>((istream *)mesh_local,&node_number,
                    (bool)(physical_names.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1),
                    (bool)(physical_names.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ & 1));
          for (position = 0; position < node_number; position = position + 1) {
            read<int>((istream *)mesh_local,&block_node_1,
                      (bool)(physical_names.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1),
                      (bool)(physical_names.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ & 1));
            sVar10 = std::vector<Omega_h::Vector<3>,_std::allocator<Omega_h::Vector<3>_>_>::size
                               ((vector<Omega_h::Vector<3>,_std::allocator<Omega_h::Vector<3>_>_> *)
                                &node_number_map._M_t._M_impl.super__Rb_tree_header._M_node_count);
            iVar6 = (int)sVar10 + position;
            coords.super_Few<double,_3>.array_[2]._4_4_ = iVar6;
            pmVar11 = std::
                      map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                      operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                  *)&num_entity_blocks,&block_node_1);
            *pmVar11 = iVar6;
          }
          for (coords.super_Few<double,_3>.array_[2]._0_4_ = 0;
              coords.super_Few<double,_3>.array_[2]._0_4_ < node_number;
              coords.super_Few<double,_3>.array_[2]._0_4_ =
                   coords.super_Few<double,_3>.array_[2]._0_4_ + 1) {
            local_40 = (double *)&class_id_1;
            local_44 = 0;
            read<double>((istream *)mesh_local,local_40,
                         (bool)(physical_names.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1),
                         (bool)(physical_names.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ & 1));
            local_50 = &class_id_1;
            local_54 = 1;
            read<double>((istream *)mesh_local,(double *)&coords,
                         (bool)(physical_names.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1),
                         (bool)(physical_names.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ & 1));
            local_60 = &class_id_1;
            local_64 = 2;
            read<double>((istream *)mesh_local,coords.super_Few<double,_3>.array_ + 1,
                         (bool)(physical_names.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1),
                         (bool)(physical_names.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ & 1));
            std::vector<Omega_h::Vector<3>,_std::allocator<Omega_h::Vector<3>_>_>::push_back
                      ((vector<Omega_h::Vector<3>,_std::allocator<Omega_h::Vector<3>_>_> *)
                       &node_number_map._M_t._M_impl.super__Rb_tree_header._M_node_count,
                       (value_type *)&class_id_1);
          }
        }
      }
    }
    pMVar4 = mesh_local;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_390,"$Elements",
               (allocator *)
               ((long)&ent_class_ids._M_elems[3].super__Vector_base<int,_std::allocator<int>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    seek_line((istream *)pMVar4,(string *)local_390);
    std::__cxx11::string::~string(local_390);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&ent_class_ids._M_elems[3].super__Vector_base<int,_std::allocator<int>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    std::array<std::vector<int,_std::allocator<int>_>,_4UL>::array
              ((array<std::vector<int,_std::allocator<int>_>,_4UL> *)
               &ent_nodes._M_elems[3].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::array<std::vector<int,_std::allocator<int>_>,_4UL>::array
              ((array<std::vector<int,_std::allocator<int>_>,_4UL> *)&num_entity_blocks_1);
    total_num_ents = 0;
    if (_data_size < 4.0) {
      std::istream::operator>>
                (mesh_local,(int *)((long)&ent2physical._M_elems[3]._M_h._M_single_bucket + 4));
      if (ent2physical._M_elems[3]._M_h._M_single_bucket._4_4_ < 0) {
        fail("assertion %s failed at %s +%d\n","nents >= 0",
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_gmsh.cpp"
             ,0x18c);
      }
      std::
      array<std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>,_4UL>
      ::array((array<std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>,_4UL>
               *)&type);
      if ((physical_names.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
        for (type_1 = 0; type_1 < ent2physical._M_elems[3]._M_h._M_single_bucket._4_4_;
            type_1 = type_1 + 1) {
          std::istream::operator>>(mesh_local,&dim_3);
          if (dim_3 < 1) {
            fail("assertion %s failed at %s +%d\n","number > 0",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_gmsh.cpp"
                 ,0x1b4);
          }
          std::istream::operator>>(mesh_local,&ntags_1);
          physical_1 = type_dim(ntags_1);
          OVar7 = type_family(ntags_1);
          if (OVar7 == OMEGA_H_HYPERCUBE) {
            total_num_ents = 1;
          }
          std::istream::operator>>(mesh_local,&elementary_1);
          if (elementary_1 < 2) {
            fail("assertion %s failed at %s +%d\n","ntags >= 2",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_gmsh.cpp"
                 ,0x1bb);
          }
          pvVar8 = (void *)std::istream::operator>>(mesh_local,&local_5f4);
          std::istream::operator>>(pvVar8,&local_5f8);
          pvVar12 = std::array<std::vector<int,_std::allocator<int>_>,_4UL>::operator[]
                              ((array<std::vector<int,_std::allocator<int>_>,_4UL> *)
                               &ent_nodes._M_elems[3].super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage,(long)physical_1);
          std::vector<int,_std::allocator<int>_>::push_back(pvVar12,&local_5f8);
          if (local_5f4 != 0) {
            puVar15 = (unordered_map<int,int,std::hash<int>,std::equal_to<int>,std::allocator<std::pair<int_const,int>>>
                       *)std::
                         array<std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>,_4UL>
                         ::operator[]((array<std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>,_4UL>
                                       *)&type,(long)physical_1);
            pVar21 = std::
                     unordered_map<int,int,std::hash<int>,std::equal_to<int>,std::allocator<std::pair<int_const,int>>>
                     ::emplace<int&,int&>(puVar15,&local_5f8,&local_5f4);
            _j_1 = (__node_type *)
                   pVar21.first.super__Node_iterator_base<std::pair<const_int,_int>,_false>._M_cur;
            local_600 = pVar21.second;
          }
          for (node_number_4 = 2; node_number_4 < elementary_1; node_number_4 = node_number_4 + 1) {
            std::istream::operator>>(mesh_local,&neev_1);
          }
          j_2 = physical_1 + 1;
          for (dim_4 = 0; dim_4 < j_2; dim_4 = dim_4 + 1) {
            std::istream::operator>>(mesh_local,&local_618);
            pvVar12 = std::array<std::vector<int,_std::allocator<int>_>,_4UL>::operator[]
                                ((array<std::vector<int,_std::allocator<int>_>,_4UL> *)
                                 &num_entity_blocks_1,(long)physical_1);
            local_620 = local_618 + -1;
            std::vector<int,_std::allocator<int>_>::push_back(pvVar12,&local_620);
          }
        }
      }
      else {
        eat_newlines((istream *)mesh_local);
        nfollow = 0;
        while (nfollow < ent2physical._M_elems[3]._M_h._M_single_bucket._4_4_) {
          binary::read_value<int>
                    ((istream *)mesh_local,&ntags,
                     (bool)(physical_names.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ & 1));
          binary::read_value<int>
                    ((istream *)mesh_local,&dim_2,
                     (bool)(physical_names.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ & 1));
          binary::read_value<int>
                    ((istream *)mesh_local,&neev,
                     (bool)(physical_names.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ & 1));
          j = type_dim(ntags);
          OVar7 = type_family(ntags);
          if (OVar7 == OMEGA_H_HYPERCUBE) {
            total_num_ents = 1;
          }
          local_e4 = total_num_ents;
          local_e8 = j;
          local_ec = 0;
          if (total_num_ents == 0) {
            local_2c = j;
            local_30 = 0;
            if (j == 0) {
              local_914 = 1;
            }
            else {
              if (j == 1) {
                local_91c = 2;
              }
              else {
                if (j == 2) {
                  local_928 = 3;
                }
                else {
                  if (j == 3) {
                    local_938 = 4;
                  }
                  else {
                    local_938 = -1;
                  }
                  local_928 = local_938;
                }
                local_91c = local_928;
              }
              local_914 = local_91c;
            }
            local_93c = local_914;
          }
          else {
            local_14 = j;
            local_18 = 0;
            if (j == 0) {
              local_940 = 1;
            }
            else {
              if (j == 1) {
                local_948 = 2;
              }
              else {
                if (j == 2) {
                  local_954 = 4;
                }
                else {
                  if (j == 3) {
                    local_964 = 8;
                  }
                  else {
                    local_964 = -1;
                  }
                  local_954 = local_964;
                }
                local_948 = local_954;
              }
              local_940 = local_948;
            }
            local_93c = local_940;
          }
          number_2 = local_93c;
          if (neev < 2) {
            fail("assertion %s failed at %s +%d\n","ntags >= 2",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_gmsh.cpp"
                 ,0x19b);
          }
          for (physical = 0; physical < dim_2; physical = physical + 1) {
            binary::read_value<int>
                      ((istream *)mesh_local,&elementary,
                       (bool)(physical_names.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ & 1));
            binary::read_value<int>
                      ((istream *)mesh_local,&local_5b4,
                       (bool)(physical_names.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ & 1));
            binary::read_value<int>
                      ((istream *)mesh_local,&local_5b8,
                       (bool)(physical_names.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ & 1));
            pvVar12 = std::array<std::vector<int,_std::allocator<int>_>,_4UL>::operator[]
                                ((array<std::vector<int,_std::allocator<int>_>,_4UL> *)
                                 &ent_nodes._M_elems[3].
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage,(long)j);
            std::vector<int,_std::allocator<int>_>::push_back(pvVar12,&local_5b8);
            if (local_5b4 != 0) {
              puVar15 = (unordered_map<int,int,std::hash<int>,std::equal_to<int>,std::allocator<std::pair<int_const,int>>>
                         *)std::
                           array<std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>,_4UL>
                           ::operator[]((array<std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>,_4UL>
                                         *)&type,(long)j);
              pVar21 = std::
                       unordered_map<int,int,std::hash<int>,std::equal_to<int>,std::allocator<std::pair<int_const,int>>>
                       ::emplace<int&,int&>(puVar15,&local_5b8,&local_5b4);
              _ignored = (__node_type *)
                         pVar21.first.super__Node_iterator_base<std::pair<const_int,_int>,_false>.
                         _M_cur;
              local_5c0 = pVar21.second;
            }
            for (k_1 = 2; k_1 < neev; k_1 = k_1 + 1) {
              binary::read_value<int>((istream *)mesh_local,&node_number_3,false);
            }
            for (local_5d4 = 0; local_5d4 < number_2; local_5d4 = local_5d4 + 1) {
              binary::read_value<int>
                        ((istream *)mesh_local,&i_3,
                         (bool)(physical_names.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ & 1));
              pvVar12 = std::array<std::vector<int,_std::allocator<int>_>,_4UL>::operator[]
                                  ((array<std::vector<int,_std::allocator<int>_>,_4UL> *)
                                   &num_entity_blocks_1,(long)j);
              number_3 = i_3 + -1;
              std::vector<int,_std::allocator<int>_>::push_back(pvVar12,&number_3);
            }
            nfollow = nfollow + 1;
          }
        }
      }
      for (entities._4_4_ = 0; iVar6 = entities._4_4_,
          sVar10 = std::
                   array<std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>,_4UL>
                   ::size((array<std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>,_4UL>
                           *)&type), iVar6 < (int)sVar10; entities._4_4_ = entities._4_4_ + 1) {
        this_00 = std::
                  array<std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>,_4UL>
                  ::operator[]((array<std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>,_4UL>
                                *)&type,(long)entities._4_4_);
        __end4 = std::
                 unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                 ::begin(this_00);
        pair = (value_type *)
               std::
               unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
               ::end(this_00);
        while (bVar5 = std::__detail::operator!=
                                 (&__end4.
                                   super__Node_iterator_base<std::pair<const_int,_int>,_false>,
                                  (_Node_iterator_base<std::pair<const_int,_int>,_false> *)&pair),
              bVar5) {
          _physical_2 = std::__detail::_Node_const_iterator<std::pair<const_int,_int>,_false,_false>
                        ::operator*(&__end4);
          local_654 = _physical_2->first;
          iVar6 = _physical_2->second;
          std::__cxx11::to_string(local_678,iVar6);
          sVar10 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_170);
          if (iVar6 <= (int)sVar10) {
            pvVar16 = std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)local_170,(long)(iVar6 + -1));
            std::__cxx11::string::operator=((string *)local_678,(string *)pvVar16);
          }
          this_01 = (vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>> *)
                    std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>
                    ::operator[](&local_108->class_sets,(key_type *)local_678);
          std::vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>>::
          emplace_back<int&,int_const&>(this_01,(int *)((long)&entities + 4),&local_654);
          std::__cxx11::string::~string((string *)local_678);
          std::__detail::_Node_const_iterator<std::pair<const_int,_int>,_false,_false>::operator++
                    (&__end4);
        }
      }
      std::
      array<std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>,_4UL>
      ::~array((array<std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>,_4UL>
                *)&type);
    }
    else {
      eat_newlines((istream *)mesh_local);
      read<int>((istream *)mesh_local,&element_tag,
                (bool)(physical_names.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1),
                (bool)(physical_names.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ & 1));
      read<int>((istream *)mesh_local,&entity_block_2,
                (bool)(physical_names.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1),
                (bool)(physical_names.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ & 1));
      if (4.1 <= _data_size) {
        read<int>((istream *)mesh_local,&class_id_2,
                  (bool)(physical_names.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1),
                  (bool)(physical_names.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ & 1));
        read<int>((istream *)mesh_local,&class_id_2,
                  (bool)(physical_names.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1),
                  (bool)(physical_names.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ & 1));
      }
      for (class_dim_2 = 0; class_dim_2 < element_tag; class_dim_2 = class_dim_2 + 1) {
        if ((_data_size != 4.0) || (NAN(_data_size))) {
          read<int>((istream *)mesh_local,&num_block_ents,
                    (bool)(physical_names.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1),
                    (bool)(physical_names.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ & 1));
          read<int>((istream *)mesh_local,&ent_type,
                    (bool)(physical_names.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1),
                    (bool)(physical_names.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ & 1));
        }
        else {
          read<int>((istream *)mesh_local,&ent_type,
                    (bool)(physical_names.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1),
                    (bool)(physical_names.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ & 1));
          read<int>((istream *)mesh_local,&num_block_ents,
                    (bool)(physical_names.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1),
                    (bool)(physical_names.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ & 1));
        }
        read<int>((istream *)mesh_local,&dim_1,
                  (bool)(physical_names.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1),
                  (bool)(physical_names.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ & 1));
        read<int>((istream *)mesh_local,&nodes_per_ent,
                  (bool)(physical_names.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1),
                  (bool)(physical_names.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ & 1));
        block_ent = type_dim(dim_1);
        if (block_ent != num_block_ents) {
          fail("assertion %s failed at %s +%d\n","dim == class_dim",
               "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_gmsh.cpp"
               ,0x172);
        }
        OVar7 = type_family(dim_1);
        if (OVar7 == OMEGA_H_HYPERCUBE) {
          total_num_ents = 1;
        }
        local_d8 = total_num_ents;
        local_dc = block_ent;
        local_e0 = 0;
        if (total_num_ents == 0) {
          local_34 = block_ent;
          local_38 = 0;
          if (block_ent == 0) {
            local_884 = 1;
          }
          else {
            if (block_ent == 1) {
              local_88c = 2;
            }
            else {
              if (block_ent == 2) {
                local_898 = 3;
              }
              else {
                if (block_ent == 3) {
                  local_8a8 = 4;
                }
                else {
                  local_8a8 = -1;
                }
                local_898 = local_8a8;
              }
              local_88c = local_898;
            }
            local_884 = local_88c;
          }
          local_8ac = local_884;
        }
        else {
          local_1c = block_ent;
          local_20 = 0;
          if (block_ent == 0) {
            local_8b0 = 1;
          }
          else {
            if (block_ent == 1) {
              local_8b8 = 2;
            }
            else {
              if (block_ent == 2) {
                local_8c4 = 4;
              }
              else {
                if (block_ent == 3) {
                  local_8d4 = 8;
                }
                else {
                  local_8d4 = -1;
                }
                local_8c4 = local_8d4;
              }
              local_8b8 = local_8c4;
            }
            local_8b0 = local_8b8;
          }
          local_8ac = local_8b0;
        }
        ent_number = local_8ac;
        this = &ent_nodes._M_elems[3].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
        pvVar12 = std::array<std::vector<int,_std::allocator<int>_>,_4UL>::operator[]
                            ((array<std::vector<int,_std::allocator<int>_>,_4UL> *)this,
                             (long)block_ent);
        pvVar13 = std::array<std::vector<int,_std::allocator<int>_>,_4UL>::operator[]
                            ((array<std::vector<int,_std::allocator<int>_>,_4UL> *)this,
                             (long)block_ent);
        sVar10 = std::vector<int,_std::allocator<int>_>::size(pvVar13);
        std::vector<int,_std::allocator<int>_>::reserve(pvVar12,sVar10 + (long)nodes_per_ent);
        pvVar12 = std::array<std::vector<int,_std::allocator<int>_>,_4UL>::operator[]
                            ((array<std::vector<int,_std::allocator<int>_>,_4UL> *)
                             &num_entity_blocks_1,(long)block_ent);
        pvVar13 = std::array<std::vector<int,_std::allocator<int>_>,_4UL>::operator[]
                            ((array<std::vector<int,_std::allocator<int>_>,_4UL> *)
                             &num_entity_blocks_1,(long)block_ent);
        sVar10 = std::vector<int,_std::allocator<int>_>::size(pvVar13);
        std::vector<int,_std::allocator<int>_>::reserve
                  (pvVar12,sVar10 + (long)(nodes_per_ent * ent_number));
        for (ent_node = 0; ent_node < nodes_per_ent; ent_node = ent_node + 1) {
          pvVar12 = std::array<std::vector<int,_std::allocator<int>_>,_4UL>::operator[]
                              ((array<std::vector<int,_std::allocator<int>_>,_4UL> *)
                               &ent_nodes._M_elems[3].super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage,(long)block_ent);
          std::vector<int,_std::allocator<int>_>::push_back(pvVar12,&ent_type);
          read<int>((istream *)mesh_local,&node_number_2,
                    (bool)(physical_names.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1),
                    (bool)(physical_names.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ & 1));
          for (local_490 = 0; local_490 < ent_number; local_490 = local_490 + 1) {
            read<int>((istream *)mesh_local,(int *)((long)&it._M_node + 4),
                      (bool)(physical_names.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1),
                      (bool)(physical_names.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ & 1));
            local_4a0._M_node =
                 (_Base_ptr)
                 std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                 find((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                      &num_entity_blocks,(key_type *)((long)&it._M_node + 4));
            iStack_4a8 = std::
                         map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                         ::end((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                *)&num_entity_blocks);
            bVar5 = std::operator!=(&local_4a0,&stack0xfffffffffffffb58);
            if (!bVar5) {
              fail("assertion %s failed at %s +%d\n","it != node_number_map.end()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_gmsh.cpp"
                   ,0x183);
            }
            pvVar12 = std::array<std::vector<int,_std::allocator<int>_>,_4UL>::operator[]
                                ((array<std::vector<int,_std::allocator<int>_>,_4UL> *)
                                 &num_entity_blocks_1,(long)block_ent);
            ppVar14 = std::_Rb_tree_iterator<std::pair<const_int,_int>_>::operator->(&local_4a0);
            std::vector<int,_std::allocator<int>_>::push_back(pvVar12,&ppVar14->second);
          }
        }
      }
    }
    pvVar12 = std::array<std::vector<int,_std::allocator<int>_>,_4UL>::operator[]
                        ((array<std::vector<int,_std::allocator<int>_>,_4UL> *)&num_entity_blocks_1,
                         3);
    sVar10 = std::vector<int,_std::allocator<int>_>::size(pvVar12);
    if (sVar10 == 0) {
      pvVar12 = std::array<std::vector<int,_std::allocator<int>_>,_4UL>::operator[]
                          ((array<std::vector<int,_std::allocator<int>_>,_4UL> *)
                           &num_entity_blocks_1,2);
      sVar10 = std::vector<int,_std::allocator<int>_>::size(pvVar12);
      if (sVar10 == 0) {
        pvVar12 = std::array<std::vector<int,_std::allocator<int>_>,_4UL>::operator[]
                            ((array<std::vector<int,_std::allocator<int>_>,_4UL> *)
                             &num_entity_blocks_1,1);
        sVar10 = std::vector<int,_std::allocator<int>_>::size(pvVar12);
        if (sVar10 == 0) {
          fail("There were no Elements of dimension higher than zero!\n");
        }
        host_coords.write_.shared_alloc_.direct_ptr._4_4_ = 1;
      }
      else {
        host_coords.write_.shared_alloc_.direct_ptr._4_4_ = 2;
      }
    }
    else {
      host_coords.write_.shared_alloc_.direct_ptr._4_4_ = 3;
    }
    iVar6 = node_tag * host_coords.write_.shared_alloc_.direct_ptr._4_4_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&i_4,"",(allocator *)((long)&j_3 + 3));
    HostWrite<double>::HostWrite((HostWrite<double> *)local_690,iVar6,(string *)&i_4);
    std::__cxx11::string::~string((string *)&i_4);
    std::allocator<char>::~allocator((allocator<char> *)((long)&j_3 + 3));
    for (ent_dim = 0; ent_dim < node_tag; ent_dim = ent_dim + 1) {
      for (neev_2 = 0; neev_2 < host_coords.write_.shared_alloc_.direct_ptr._4_4_;
          neev_2 = neev_2 + 1) {
        local_d0 = std::vector<Omega_h::Vector<3>,_std::allocator<Omega_h::Vector<3>_>_>::operator[]
                             ((vector<Omega_h::Vector<3>,_std::allocator<Omega_h::Vector<3>_>_> *)
                              &node_number_map._M_t._M_impl.super__Rb_tree_header._M_node_count,
                              (long)ent_dim);
        local_d4 = neev_2;
        dVar1 = (local_d0->super_Few<double,_3>).array_[neev_2];
        pdVar17 = HostWrite<double>::operator[]
                            ((HostWrite<double> *)local_690,
                             ent_dim * host_coords.write_.shared_alloc_.direct_ptr._4_4_ + neev_2);
        *pdVar17 = dVar1;
      }
    }
    for (ndim_ents = host_coords.write_.shared_alloc_.direct_ptr._4_4_; -1 < ndim_ents;
        ndim_ents = ndim_ents + -1) {
      local_f0 = total_num_ents;
      stream_local._4_4_ = ndim_ents;
      stream_local._0_4_ = 0;
      if (total_num_ents == 0) {
        local_24 = ndim_ents;
        local_28 = 0;
        if (ndim_ents == 0) {
          local_9c4 = 1;
        }
        else {
          if (ndim_ents == 1) {
            local_9cc = 2;
          }
          else {
            if (ndim_ents == 2) {
              local_9d8 = 3;
            }
            else {
              if (ndim_ents == 3) {
                local_9e8 = 4;
              }
              else {
                local_9e8 = 0xffffffff;
              }
              local_9d8 = local_9e8;
            }
            local_9cc = local_9d8;
          }
          local_9c4 = local_9cc;
        }
        local_9ec = local_9c4;
      }
      else {
        local_c = ndim_ents;
        local_10 = 0;
        if (ndim_ents == 0) {
          local_9f0 = 1;
        }
        else {
          if (ndim_ents == 1) {
            local_9f8 = 2;
          }
          else {
            if (ndim_ents == 2) {
              local_a04 = 4;
            }
            else {
              if (ndim_ents == 3) {
                local_a14 = 8;
              }
              else {
                local_a14 = 0xffffffff;
              }
              local_a04 = local_a14;
            }
            local_9f8 = local_a04;
          }
          local_9f0 = local_9f8;
        }
        local_9ec = local_9f0;
      }
      host_ev2v.write_.shared_alloc_.direct_ptr._4_4_ = local_9ec;
      pvVar12 = std::array<std::vector<int,_std::allocator<int>_>,_4UL>::operator[]
                          ((array<std::vector<int,_std::allocator<int>_>,_4UL> *)
                           &num_entity_blocks_1,(long)ndim_ents);
      sVar10 = std::vector<int,_std::allocator<int>_>::size(pvVar12);
      host_ev2v.write_.shared_alloc_.direct_ptr._0_4_ =
           (int)((long)((ulong)(uint)((int)sVar10 >> 0x1f) << 0x20 | sVar10 & 0xffffffff) /
                (long)(int)host_ev2v.write_.shared_alloc_.direct_ptr._4_4_);
      ev2v = (LOs *)(ulong)host_ev2v.write_.shared_alloc_.direct_ptr._4_4_;
      iVar6 = (int)host_ev2v.write_.shared_alloc_.direct_ptr *
              host_ev2v.write_.shared_alloc_.direct_ptr._4_4_;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_6f8,"",
                 (allocator *)((long)&host_class_id.write_.shared_alloc_.direct_ptr + 7));
      HostWrite<int>::HostWrite((HostWrite<int> *)local_6d8,iVar6,(string *)local_6f8);
      std::__cxx11::string::~string(local_6f8);
      std::allocator<char>::~allocator
                ((allocator<char> *)((long)&host_class_id.write_.shared_alloc_.direct_ptr + 7));
      size_in = (int)host_ev2v.write_.shared_alloc_.direct_ptr;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&i_5,"",(allocator *)((long)&j_4 + 3));
      HostWrite<int>::HostWrite((HostWrite<int> *)local_710,size_in,(string *)&i_5);
      std::__cxx11::string::~string((string *)&i_5);
      std::allocator<char>::~allocator((allocator<char> *)((long)&j_4 + 3));
      pvVar8 = extraout_RDX;
      for (local_738 = 0; local_738 < (int)host_ev2v.write_.shared_alloc_.direct_ptr;
          local_738 = local_738 + 1) {
        for (eqv2v.write_.shared_alloc_.direct_ptr._4_4_ = 0;
            eqv2v.write_.shared_alloc_.direct_ptr._4_4_ <
            (int)host_ev2v.write_.shared_alloc_.direct_ptr._4_4_;
            eqv2v.write_.shared_alloc_.direct_ptr._4_4_ =
                 eqv2v.write_.shared_alloc_.direct_ptr._4_4_ + 1) {
          pvVar12 = std::array<std::vector<int,_std::allocator<int>_>,_4UL>::operator[]
                              ((array<std::vector<int,_std::allocator<int>_>,_4UL> *)
                               &num_entity_blocks_1,(long)ndim_ents);
          pvVar18 = std::vector<int,_std::allocator<int>_>::operator[]
                              (pvVar12,(long)(int)(local_738 *
                                                   host_ev2v.write_.shared_alloc_.direct_ptr._4_4_ +
                                                  eqv2v.write_.shared_alloc_.direct_ptr._4_4_));
          vVar2 = *pvVar18;
          piVar19 = HostWrite<int>::operator[]
                              ((HostWrite<int> *)local_6d8,
                               local_738 * host_ev2v.write_.shared_alloc_.direct_ptr._4_4_ +
                               eqv2v.write_.shared_alloc_.direct_ptr._4_4_);
          *piVar19 = vVar2;
        }
        pvVar12 = std::array<std::vector<int,_std::allocator<int>_>,_4UL>::operator[]
                            ((array<std::vector<int,_std::allocator<int>_>,_4UL> *)
                             &ent_nodes._M_elems[3].super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage,(long)ndim_ents);
        puVar20 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                    (pvVar12,(long)local_738);
        uVar3 = *puVar20;
        puVar20 = (uint *)HostWrite<int>::operator[]((HostWrite<int> *)local_710,local_738);
        ev2v = (LOs *)(ulong)uVar3;
        *puVar20 = uVar3;
        pvVar8 = extraout_RDX_00;
      }
      HostWrite<int>::write((HostWrite<int> *)&local_760,(int)local_6d8,pvVar8,(size_t)ev2v);
      Read<int>::Read((Read<int> *)local_750,&local_760);
      Write<int>::~Write(&local_760);
      pMVar4 = local_108;
      family_00 = total_num_ents;
      iVar6 = host_coords.write_.shared_alloc_.direct_ptr._4_4_;
      if (ndim_ents == host_coords.write_.shared_alloc_.direct_ptr._4_4_) {
        Read<int>::Read(&local_770,(Read<int> *)local_750);
        HostWrite<double>::write((HostWrite<double> *)&local_790,(int)local_690,__buf,(size_t)ev2v);
        Read<double>::Read(&local_780,&local_790);
        ev2v = &local_770;
        build_from_elems_and_coords(pMVar4,family_00,iVar6,ev2v,&local_780);
        Read<double>::~Read(&local_780);
        Write<double>::~Write(&local_790);
        Read<int>::~Read(&local_770);
      }
      pMVar4 = local_108;
      Read<int>::Read(&local_7a0,(Read<int> *)local_750);
      HostWrite<int>::write((HostWrite<int> *)&local_7c0,(int)local_710,__buf_00,(size_t)ev2v);
      Read<int>::Read(&local_7b0,&local_7c0);
      classify_equal_order(pMVar4,ndim_ents,&local_7a0,&local_7b0);
      Read<int>::~Read(&local_7b0);
      Write<int>::~Write(&local_7c0);
      Read<int>::~Read(&local_7a0);
      Read<int>::~Read((Read<int> *)local_750);
      HostWrite<int>::~HostWrite((HostWrite<int> *)local_710);
      HostWrite<int>::~HostWrite((HostWrite<int> *)local_6d8);
    }
    finalize_classification(local_108);
    HostWrite<double>::~HostWrite((HostWrite<double> *)local_690);
    std::array<std::vector<int,_std::allocator<int>_>,_4UL>::~array
              ((array<std::vector<int,_std::allocator<int>_>,_4UL> *)&num_entity_blocks_1);
    std::array<std::vector<int,_std::allocator<int>_>,_4UL>::~array
              ((array<std::vector<int,_std::allocator<int>_>,_4UL> *)
               &ent_nodes._M_elems[3].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::~map
              ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
               &num_entity_blocks);
    std::vector<Omega_h::Vector<3>,_std::allocator<Omega_h::Vector<3>_>_>::~vector
              ((vector<Omega_h::Vector<3>,_std::allocator<Omega_h::Vector<3>_>_> *)
               &node_number_map._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_170);
    return;
  }
  fail("assertion %s failed at %s +%d\n","data_size == sizeof(Real)",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_gmsh.cpp"
       ,0xea);
}

Assistant:

void read_internal(std::istream& stream, Mesh* mesh) {
  seek_line(stream, "$MeshFormat");
  Real format;
  Int file_type;
  Int data_size;
  stream >> format >> file_type >> data_size;
  OMEGA_H_CHECK(file_type == 0 || file_type == 1);
  bool is_binary = (file_type == 1);
  bool needs_swapping = false;
  if (is_binary) {
    eat_newlines(stream);
    int one;
    binary::read_value(stream, one, false);
    if (one != 1) {
      needs_swapping = true;
      binary::swap_bytes(one);
      OMEGA_H_CHECK(one == 1);
    }
  }
  OMEGA_H_CHECK(data_size == sizeof(Real));
  std::vector<std::string> physical_names;
  if (seek_optional_section(stream, "$PhysicalNames")) {
    Int num_physicals;
    read(stream, num_physicals, is_binary, needs_swapping);
    physical_names.reserve(static_cast<std::size_t>(num_physicals));
    eat_newlines(stream);
    for (auto i = 0; i < num_physicals; ++i) {
      Int dim, number;
      read(stream, dim, is_binary, needs_swapping);
      read(stream, number, is_binary, needs_swapping);
      OMEGA_H_CHECK(number == i + 1);
      std::string name;
      stream >> name;
      physical_names.push_back(name.substr(1, name.size() - 2));
    }
  }
  if (seek_optional_section(stream, "$Entities")) {
    read_internal_entities_section(
        *mesh, format, physical_names, stream, is_binary, needs_swapping);
    std::string line;
    std::getline(stream, line);
    // line matches "[ ]*"
    if (!line.empty()) {
      line.erase(std::remove_if(line.begin(), line.end(),
          [](unsigned char c) { return std::isspace(c); }));
    }
    OMEGA_H_CHECK(line.empty());
    std::getline(stream, line);
    OMEGA_H_CHECK(line == "$EndEntities");
  }
  seek_line(stream, "$Nodes");
  std::vector<Vector<3>> node_coords;
  std::map<int, int> node_number_map;
  int nnodes;
  if (format >= 4.0) {
    eat_newlines(stream);
    int num_entity_blocks;
    read(stream, num_entity_blocks, is_binary, needs_swapping);
    read(stream, nnodes, is_binary, needs_swapping);
    node_coords.reserve(std::size_t(nnodes));
    if (format >= 4.1) {
      int node_tag;
      read(stream, node_tag, is_binary, needs_swapping);  // min
      read(stream, node_tag, is_binary, needs_swapping);  // max
      for (int entity_block = 0; entity_block < num_entity_blocks;
           ++entity_block) {
        int class_id, class_dim;
        read(stream, class_dim, is_binary, needs_swapping);
        read(stream, class_id, is_binary, needs_swapping);
        int node_type, num_block_nodes;
        read(stream, node_type, is_binary, needs_swapping);
        read(stream, num_block_nodes, is_binary, needs_swapping);
        for (int block_node = 0; block_node < num_block_nodes; ++block_node) {
          int node_number;
          read(stream, node_number, is_binary, needs_swapping);
          const auto position = int(node_coords.size() + block_node);
          node_number_map[node_number] = position;
        }
        for (int block_node = 0; block_node < num_block_nodes; ++block_node) {
          Vector<3> coords;
          read(stream, coords[0], is_binary, needs_swapping);
          read(stream, coords[1], is_binary, needs_swapping);
          read(stream, coords[2], is_binary, needs_swapping);
          node_coords.push_back(coords);
        }
      }

    } else {
      for (int entity_block = 0; entity_block < num_entity_blocks;
           ++entity_block) {
        int class_id, class_dim;
        read(stream, class_id, is_binary, needs_swapping);
        read(stream, class_dim, is_binary, needs_swapping);
        int node_type, num_block_nodes;
        read(stream, node_type, is_binary, needs_swapping);
        read(stream, num_block_nodes, is_binary, needs_swapping);
        for (int block_node = 0; block_node < num_block_nodes; ++block_node) {
          int node_number;
          read(stream, node_number, is_binary, needs_swapping);
          node_number_map[node_number] = int(node_coords.size());
          Vector<3> coords;
          read(stream, coords[0], is_binary, needs_swapping);
          read(stream, coords[1], is_binary, needs_swapping);
          read(stream, coords[2], is_binary, needs_swapping);
          node_coords.push_back(coords);
        }
      }
    }
  } else {
    stream >> nnodes;
    OMEGA_H_CHECK(nnodes >= 0);
    node_coords.reserve(std::size_t(nnodes));
    eat_newlines(stream);
    for (LO i = 0; i < nnodes; ++i) {
      LO number;
      read(stream, number, is_binary, needs_swapping);
      // the documentation says numbers don't have to be linear,
      // but so far they have been and assuming they are saves
      // me a big lookup structure (e.g. std::map)
      OMEGA_H_CHECK(number == i + 1);
      Vector<3> coords;
      read(stream, coords[0], is_binary, needs_swapping);
      read(stream, coords[1], is_binary, needs_swapping);
      read(stream, coords[2], is_binary, needs_swapping);
      node_coords.push_back(coords);
    }
  }
  seek_line(stream, "$Elements");
  std::array<std::vector<int>, 4> ent_class_ids;
  std::array<std::vector<int>, 4> ent_nodes;
  Omega_h_Family family = OMEGA_H_SIMPLEX;
  if (format >= 4.0) {
    eat_newlines(stream);
    int num_entity_blocks, total_num_ents;
    read(stream, num_entity_blocks, is_binary, needs_swapping);
    read(stream, total_num_ents, is_binary, needs_swapping);
    if (format >= 4.1) {
      int element_tag;
      read(stream, element_tag, is_binary, needs_swapping);  // min
      read(stream, element_tag, is_binary, needs_swapping);  // max
    }
    for (int entity_block = 0; entity_block < num_entity_blocks;
         ++entity_block) {
      int class_id, class_dim;
      if (format == 4.) {
        read(stream, class_id, is_binary, needs_swapping);
        read(stream, class_dim, is_binary, needs_swapping);
      } else {
        read(stream, class_dim, is_binary, needs_swapping);
        read(stream, class_id, is_binary, needs_swapping);
      }
      int ent_type, num_block_ents;
      read(stream, ent_type, is_binary, needs_swapping);
      read(stream, num_block_ents, is_binary, needs_swapping);
      Int dim = type_dim(ent_type);
      OMEGA_H_CHECK(dim == class_dim);
      if (type_family(ent_type) == OMEGA_H_HYPERCUBE) {
        family = OMEGA_H_HYPERCUBE;
      }
      int nodes_per_ent = element_degree(family, dim, 0);
      ent_class_ids[dim].reserve(
          ent_class_ids[dim].size() + std::size_t(num_block_ents));
      ent_nodes[dim].reserve(
          ent_nodes[dim].size() + std::size_t(num_block_ents * nodes_per_ent));
      for (int block_ent = 0; block_ent < num_block_ents; ++block_ent) {
        ent_class_ids[dim].push_back(class_id);
        int ent_number;
        read(stream, ent_number, is_binary, needs_swapping);
        for (int ent_node = 0; ent_node < nodes_per_ent; ++ent_node) {
          int node_number;
          read(stream, node_number, is_binary, needs_swapping);
          auto it = node_number_map.find(node_number);
          OMEGA_H_CHECK(it != node_number_map.end());
          ent_nodes[dim].push_back(it->second);
        }
      }
    }

  } else {
    LO nents;
    stream >> nents;
    OMEGA_H_CHECK(nents >= 0);
    std::array<std::unordered_map<Int, Int>, 4> ent2physical;
    if (is_binary) {
      eat_newlines(stream);
      LO i = 0;
      while (i < nents) {
        I32 type, nfollow, ntags;
        binary::read_value(stream, type, needs_swapping);
        binary::read_value(stream, nfollow, needs_swapping);
        binary::read_value(stream, ntags, needs_swapping);
        Int dim = type_dim(type);
        if (type_family(type) == OMEGA_H_HYPERCUBE) {
          family = OMEGA_H_HYPERCUBE;
        }
        Int neev = element_degree(family, dim, 0);
        OMEGA_H_CHECK(ntags >= 2);
        for (Int j = 0; j < nfollow; ++j, ++i) {
          I32 number, physical, elementary;
          binary::read_value(stream, number, needs_swapping);
          binary::read_value(stream, physical, needs_swapping);
          binary::read_value(stream, elementary, needs_swapping);
          ent_class_ids[dim].push_back(elementary);
          if (physical != 0) {
            ent2physical[dim].emplace(elementary, physical);
          }
          for (Int k = 2; k < ntags; ++k) {
            I32 ignored;
            binary::read_value(stream, ignored, false);
          }
          for (Int k = 0; k < neev; ++k) {
            I32 node_number;
            binary::read_value(stream, node_number, needs_swapping);
            ent_nodes[dim].push_back(node_number - 1);
          }
        }
      }
    } else {
      for (LO i = 0; i < nents; ++i) {
        LO number;
        stream >> number;
        OMEGA_H_CHECK(number > 0);
        Int type;
        stream >> type;
        Int dim = type_dim(type);
        if (type_family(type) == OMEGA_H_HYPERCUBE) family = OMEGA_H_HYPERCUBE;
        Int ntags;
        stream >> ntags;
        OMEGA_H_CHECK(ntags >= 2);
        Int physical, elementary;
        stream >> physical >> elementary;
        ent_class_ids[dim].push_back(elementary);
        if (physical != 0) {
          ent2physical[dim].emplace(elementary, physical);
        }
        Int tag;
        for (Int j = 2; j < ntags; ++j) {
          stream >> tag;
        }
        Int neev = dim + 1;
        LO node_number;
        for (Int j = 0; j < neev; ++j) {
          stream >> node_number;
          ent_nodes[dim].push_back(node_number - 1);
        }
      }
    }
    for (Int dim = 0; dim < static_cast<Int>(ent2physical.size()); ++dim) {
      const auto& entities = ent2physical[dim];
      for (const auto& pair : entities) {
        const auto entity = pair.first;
        const auto physical = pair.second;
        std::string physical_name(std::to_string(physical));
        if (physical <= static_cast<Int>(physical_names.size())) {
          physical_name = physical_names[physical - 1];
        }
        mesh->class_sets[physical_name].emplace_back(dim, entity);
      }
    }
  }
  Int max_dim;
  if (ent_nodes[3].size()) {
    max_dim = 3;
  } else if (ent_nodes[2].size()) {
    max_dim = 2;
  } else if (ent_nodes[1].size()) {
    max_dim = 1;
  } else {
    Omega_h_fail("There were no Elements of dimension higher than zero!\n");
  }
  HostWrite<Real> host_coords(nnodes * max_dim);
  for (LO i = 0; i < nnodes; ++i) {
    for (Int j = 0; j < max_dim; ++j) {
      host_coords[i * max_dim + j] =
          node_coords[static_cast<std::size_t>(i)][j];
    }
  }
  for (Int ent_dim = max_dim; ent_dim >= 0; --ent_dim) {
    Int neev = element_degree(family, ent_dim, VERT);
    LO ndim_ents = static_cast<LO>(ent_nodes[ent_dim].size()) / neev;
    HostWrite<LO> host_ev2v(ndim_ents * neev);
    HostWrite<LO> host_class_id(ndim_ents);
    for (LO i = 0; i < ndim_ents; ++i) {
      for (Int j = 0; j < neev; ++j) {
        host_ev2v[i * neev + j] =
            ent_nodes[ent_dim][static_cast<std::size_t>(i * neev + j)];
      }
      host_class_id[i] = ent_class_ids[ent_dim][static_cast<std::size_t>(i)];
    }
    auto eqv2v = Read<LO>(host_ev2v.write());
    if (ent_dim == max_dim) {
      build_from_elems_and_coords(
          mesh, family, max_dim, eqv2v, host_coords.write());
    }
    classify_equal_order(mesh, ent_dim, eqv2v, host_class_id.write());
  }
  finalize_classification(mesh);
}